

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF.h
# Opt level: O2

SubChunkHeader Assimp::IFF::LoadSubChunk(uint8_t **outFile)

{
  uint uVar1;
  uint *puVar2;
  uint uVar3;
  SubChunkHeader SVar4;
  
  puVar2 = (uint *)*outFile;
  uVar1 = *puVar2;
  *outFile = (uint8_t *)(puVar2 + 1);
  uVar3 = puVar2[1];
  *outFile = (uint8_t *)((long)puVar2 + 6);
  SVar4.type = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  SVar4.length = (ushort)uVar3 << 8 | (ushort)uVar3 >> 8;
  SVar4._6_2_ = 0;
  return SVar4;
}

Assistant:

inline SubChunkHeader LoadSubChunk(uint8_t*& outFile)
{
    SubChunkHeader head;
    ::memcpy(&head.type, outFile, 4);
    outFile += 4;
    ::memcpy(&head.length, outFile, 2);
    outFile += 2;
    AI_LSWAP2(head.length);
    AI_LSWAP4(head.type);
    return head;
}